

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O2

REF_STATUS
ref_update_tet_guess(REF_CELL ref_cell,REF_INT node0,REF_INT node1,REF_INT node2,REF_INT *guess)

{
  uint uVar1;
  REF_INT cell1;
  REF_INT cell0;
  REF_INT face_nodes [4];
  
  face_nodes[0] = node0;
  face_nodes[1] = node1;
  face_nodes[2] = node2;
  face_nodes[3] = node0;
  uVar1 = ref_cell_with_face(ref_cell,face_nodes,&cell0,&cell1);
  if (uVar1 == 0) {
    if (cell0 == -1) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x338,
             "ref_update_tet_guess","bary update missing first");
      uVar1 = 1;
    }
    else {
      if (cell1 == -1) {
        *guess = -1;
      }
      else if (*guess == cell0) {
        *guess = cell1;
      }
      else {
        if (*guess != cell1) {
          return 5;
        }
        *guess = cell0;
      }
      uVar1 = 0;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x337,
           "ref_update_tet_guess",(ulong)uVar1,"next");
  }
  return uVar1;
}

Assistant:

REF_FCN static REF_STATUS ref_update_tet_guess(REF_CELL ref_cell, REF_INT node0,
                                               REF_INT node1, REF_INT node2,
                                               REF_INT *guess) {
  REF_INT face_nodes[4], cell0, cell1;

  face_nodes[0] = node0;
  face_nodes[1] = node1;
  face_nodes[2] = node2;
  face_nodes[3] = node0;

  RSS(ref_cell_with_face(ref_cell, face_nodes, &cell0, &cell1), "next");
  if (REF_EMPTY == cell0) THROW("bary update missing first");
  if (REF_EMPTY == cell1) { /* hit boundary */
    *guess = REF_EMPTY;
    return REF_SUCCESS;
  }

  if (*guess == cell0) {
    *guess = cell1;
    return REF_SUCCESS;
  }
  if (*guess == cell1) {
    *guess = cell0;
    return REF_SUCCESS;
  }

  return REF_NOT_FOUND;
}